

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkparse.c
# Opt level: O3

int pk_parse_key_pkcs8_unencrypted_der(mbedtls_pk_context *pk,uchar *key,size_t keylen)

{
  int iVar1;
  mbedtls_pk_info_t *info;
  uchar *end;
  mbedtls_pk_type_t pk_alg;
  uchar *p;
  size_t len;
  int version;
  mbedtls_asn1_buf params;
  mbedtls_pk_type_t local_4c;
  uchar *local_48;
  size_t local_40;
  int local_34;
  mbedtls_asn1_buf local_30;
  
  local_4c = MBEDTLS_PK_NONE;
  local_48 = key;
  iVar1 = mbedtls_asn1_get_tag(&local_48,key + keylen,&local_40,0x30);
  if (iVar1 != 0) {
LAB_00123668:
    return iVar1 + -0x3d00;
  }
  end = local_48 + local_40;
  iVar1 = mbedtls_asn1_get_int(&local_48,end,&local_34);
  if (iVar1 != 0) goto LAB_00123668;
  if (local_34 != 0) {
    return -0x3d80;
  }
  iVar1 = pk_get_pk_alg(&local_48,end,&local_4c,&local_30);
  if ((iVar1 != 0) || (iVar1 = mbedtls_asn1_get_tag(&local_48,end,&local_40,4), iVar1 != 0))
  goto LAB_00123668;
  if (local_40 == 0) {
    return -0x3d60;
  }
  info = mbedtls_pk_info_from_type(local_4c);
  if (info == (mbedtls_pk_info_t *)0x0) {
    return -0x3c80;
  }
  iVar1 = mbedtls_pk_setup(pk,info);
  if (iVar1 != 0) {
    return iVar1;
  }
  if (local_4c == MBEDTLS_PK_RSA) {
    iVar1 = pk_parse_key_pkcs1_der((mbedtls_rsa_context *)pk->pk_ctx,local_48,local_40);
  }
  else {
    if ((local_4c & ~MBEDTLS_PK_RSA) != MBEDTLS_PK_ECKEY) {
      return -0x3c80;
    }
    iVar1 = pk_use_ecparams(&local_30,(mbedtls_ecp_group *)pk->pk_ctx);
    if (iVar1 != 0) goto LAB_0012373d;
    iVar1 = pk_parse_key_sec1_der((mbedtls_ecp_keypair *)pk->pk_ctx,local_48,local_40);
  }
  if (iVar1 == 0) {
    return 0;
  }
LAB_0012373d:
  mbedtls_pk_free(pk);
  return iVar1;
}

Assistant:

static int pk_parse_key_pkcs8_unencrypted_der(
                                    mbedtls_pk_context *pk,
                                    const unsigned char* key,
                                    size_t keylen )
{
    int ret, version;
    size_t len;
    mbedtls_asn1_buf params;
    unsigned char *p = (unsigned char *) key;
    unsigned char *end = p + keylen;
    mbedtls_pk_type_t pk_alg = MBEDTLS_PK_NONE;
    const mbedtls_pk_info_t *pk_info;

    /*
     * This function parses the PrivateKeyInfo object (PKCS#8 v1.2 = RFC 5208)
     *
     *    PrivateKeyInfo ::= SEQUENCE {
     *      version                   Version,
     *      privateKeyAlgorithm       PrivateKeyAlgorithmIdentifier,
     *      privateKey                PrivateKey,
     *      attributes           [0]  IMPLICIT Attributes OPTIONAL }
     *
     *    Version ::= INTEGER
     *    PrivateKeyAlgorithmIdentifier ::= AlgorithmIdentifier
     *    PrivateKey ::= OCTET STRING
     *
     *  The PrivateKey OCTET STRING is a SEC1 ECPrivateKey
     */

    if( ( ret = mbedtls_asn1_get_tag( &p, end, &len,
            MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
    {
        return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT + ret );
    }

    end = p + len;

    if( ( ret = mbedtls_asn1_get_int( &p, end, &version ) ) != 0 )
        return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT + ret );

    if( version != 0 )
        return( MBEDTLS_ERR_PK_KEY_INVALID_VERSION + ret );

    if( ( ret = pk_get_pk_alg( &p, end, &pk_alg, &params ) ) != 0 )
        return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT + ret );

    if( ( ret = mbedtls_asn1_get_tag( &p, end, &len, MBEDTLS_ASN1_OCTET_STRING ) ) != 0 )
        return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT + ret );

    if( len < 1 )
        return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT +
                MBEDTLS_ERR_ASN1_OUT_OF_DATA );

    if( ( pk_info = mbedtls_pk_info_from_type( pk_alg ) ) == NULL )
        return( MBEDTLS_ERR_PK_UNKNOWN_PK_ALG );

    if( ( ret = mbedtls_pk_setup( pk, pk_info ) ) != 0 )
        return( ret );

#if defined(MBEDTLS_RSA_C)
    if( pk_alg == MBEDTLS_PK_RSA )
    {
        if( ( ret = pk_parse_key_pkcs1_der( mbedtls_pk_rsa( *pk ), p, len ) ) != 0 )
        {
            mbedtls_pk_free( pk );
            return( ret );
        }
    } else
#endif /* MBEDTLS_RSA_C */
#if defined(MBEDTLS_ECP_C)
    if( pk_alg == MBEDTLS_PK_ECKEY || pk_alg == MBEDTLS_PK_ECKEY_DH )
    {
        if( ( ret = pk_use_ecparams( &params, &mbedtls_pk_ec( *pk )->grp ) ) != 0 ||
            ( ret = pk_parse_key_sec1_der( mbedtls_pk_ec( *pk ), p, len )  ) != 0 )
        {
            mbedtls_pk_free( pk );
            return( ret );
        }
    } else
#endif /* MBEDTLS_ECP_C */
        return( MBEDTLS_ERR_PK_UNKNOWN_PK_ALG );

    return( 0 );
}